

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O0

ZyanStatus
ZydisStringAppendShortCase
          (ZyanString *destination,ZydisShortString *source,ZydisLetterCase letter_case)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uStack_70;
  char c_1;
  ZyanUSize i_1;
  char *s_1;
  ZyanUSize count_1;
  ZyanUSize index_1;
  ulong uStack_48;
  char c;
  ZyanUSize i;
  char *s;
  ZyanUSize count;
  ZyanUSize index;
  ZydisLetterCase letter_case_local;
  ZydisShortString *source_local;
  ZyanString *destination_local;
  
  if ((destination == (ZyanString *)0x0) || (source == (ZydisShortString *)0x0)) {
    __assert_fail("destination && source",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                  ,0x109,
                  "ZyanStatus ZydisStringAppendShortCase(ZyanString *, const ZydisShortString *, ZydisLetterCase)"
                 );
  }
  if ((destination->vector).allocator != (ZyanAllocator *)0x0) {
    __assert_fail("!destination->vector.allocator",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                  ,0x10a,
                  "ZyanStatus ZydisStringAppendShortCase(ZyanString *, const ZydisShortString *, ZydisLetterCase)"
                 );
  }
  if (((destination->vector).size != 0) && (source->size != '\0')) {
    if ((destination->vector).capacity < (destination->vector).size + (ulong)source->size) {
      destination_local._4_4_ = 0x80100009;
    }
    else {
      memcpy((void *)((long)(destination->vector).data + ((destination->vector).size - 1)),
             source->data,(ulong)source->size + 1);
      if (letter_case != ZYDIS_LETTER_CASE_DEFAULT) {
        if (letter_case == ZYDIS_LETTER_CASE_LOWER) {
          uVar3 = (destination->vector).size - 1;
          bVar1 = source->size;
          i = (long)(destination->vector).data + uVar3;
          for (uStack_48 = uVar3; uStack_48 < uVar3 + bVar1; uStack_48 = uStack_48 + 1) {
            bVar2 = *(byte *)i;
            if (('@' < (char)bVar2) && ((char)bVar2 < '[')) {
              *(byte *)i = bVar2 | 0x20;
            }
            i = i + 1;
          }
        }
        else {
          if (letter_case != ZYDIS_LETTER_CASE_MAX_VALUE) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                          ,0x13a,
                          "ZyanStatus ZydisStringAppendShortCase(ZyanString *, const ZydisShortString *, ZydisLetterCase)"
                         );
          }
          uVar3 = (destination->vector).size - 1;
          bVar1 = source->size;
          i_1 = (long)(destination->vector).data + uVar3;
          for (uStack_70 = uVar3; uStack_70 < uVar3 + bVar1; uStack_70 = uStack_70 + 1) {
            bVar2 = *(byte *)i_1;
            if (('`' < (char)bVar2) && ((char)bVar2 < '{')) {
              *(byte *)i_1 = bVar2 & 0xdf;
            }
            i_1 = i_1 + 1;
          }
        }
      }
      (destination->vector).size = (ulong)source->size + (destination->vector).size;
      if (*(char *)((long)(destination->vector).data + ((destination->vector).size - 1)) != '\0') {
        __assert_fail("*(char*)((ZyanU8*)(destination)->vector.data + (destination)->vector.size - 1) == \'\\0\'"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0x13e,
                      "ZyanStatus ZydisStringAppendShortCase(ZyanString *, const ZydisShortString *, ZydisLetterCase)"
                     );
      }
      destination_local._4_4_ = 0x100000;
    }
    return destination_local._4_4_;
  }
  __assert_fail("destination->vector.size && source->size",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                ,0x10b,
                "ZyanStatus ZydisStringAppendShortCase(ZyanString *, const ZydisShortString *, ZydisLetterCase)"
               );
}

Assistant:

ZYAN_INLINE ZyanStatus ZydisStringAppendShortCase(ZyanString* destination,
    const ZydisShortString* source, ZydisLetterCase letter_case)
{
    ZYAN_ASSERT(destination && source);
    ZYAN_ASSERT(!destination->vector.allocator);
    ZYAN_ASSERT(destination->vector.size && source->size);

    if (destination->vector.size + source->size > destination->vector.capacity)
    {
        return ZYAN_STATUS_INSUFFICIENT_BUFFER_SIZE;
    }

    ZYAN_MEMCPY((char*)destination->vector.data + destination->vector.size - 1, source->data,
        (ZyanUSize)source->size + 1);

    switch (letter_case)
    {
    case ZYDIS_LETTER_CASE_DEFAULT:
        break;
    case ZYDIS_LETTER_CASE_LOWER:
    {
        const ZyanUSize index = destination->vector.size - 1;
        const ZyanUSize count = source->size;
        char* s = (char*)destination->vector.data + index;
        for (ZyanUSize i = index; i < index + count; ++i)
        {
            const char c = *s;
            if ((c >= 'A') && (c <= 'Z'))
            {
                *s = c | 32;
            }
            ++s;
        }
        break;
    }
    case ZYDIS_LETTER_CASE_UPPER:
    {
        const ZyanUSize index = destination->vector.size - 1;
        const ZyanUSize count = source->size;
        char* s = (char*)destination->vector.data + index;
        for (ZyanUSize i = index; i < index + count; ++i)
        {
            const char c = *s;
            if ((c >= 'a') && (c <= 'z'))
            {
                *s = c & ~32;
            }
            ++s;
        }
        break;
    }
    default:
        ZYAN_UNREACHABLE;
    }

    destination->vector.size += source->size;
    ZYDIS_STRING_ASSERT_NULLTERMINATION(destination);

    return ZYAN_STATUS_SUCCESS;
}